

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

void __thiscall
PSVIWriterHandlers::processMemberTypeDefinitions
          (PSVIWriterHandlers *this,XSSimpleTypeDefinitionList *memberTypes)

{
  uint uVar1;
  XSSimpleTypeDefinition *type;
  
  if (memberTypes != (XSSimpleTypeDefinitionList *)0x0) {
    sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinitions);
    for (uVar1 = 0; (ulong)uVar1 < *(ulong *)(memberTypes + 0x10); uVar1 = uVar1 + 1) {
      type = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition>::elementAt
                       ((BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)memberTypes,
                        (ulong)uVar1);
      processTypeDefinitionOrRef
                (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinition,
                 (XSTypeDefinition *)type);
    }
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinitions);
    return;
  }
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinitions);
  return;
}

Assistant:

void PSVIWriterHandlers::processMemberTypeDefinitions(XSSimpleTypeDefinitionList* memberTypes) {
	if (memberTypes == NULL) {
		sendElementEmpty(PSVIUni::fgMemberTypeDefinitions);
	} else {
		sendIndentedElement(PSVIUni::fgMemberTypeDefinitions);
		for (unsigned int i = 0; i < memberTypes->size(); i++) {
			processTypeDefinitionOrRef(PSVIUni::fgMemberTypeDefinition, (XSTypeDefinition*)memberTypes->elementAt(i));
		}
		sendUnindentedElement(PSVIUni::fgMemberTypeDefinitions);
	}
}